

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

void fy_emit_write_indicator
               (fy_emitter *emit,document_indicator indicator,int flags,int indent,
               fy_emitter_write_type wtype)

{
  fy_emitter_cfg_flags fVar1;
  uint c;
  int iVar2;
  bool bVar3;
  
  switch(indicator) {
  case di_question_mark:
    if ((emit->flags & 1) == 0) {
      fy_emit_putc(emit,fyewt_whitespace,0x20);
      *(byte *)&emit->flags = (byte)emit->flags | 1;
    }
    iVar2 = 0x3f;
    goto LAB_0012605d;
  case di_colon:
    if ((flags & 8U) == 0) {
      if (((emit->flow_level == 0) &&
          (fVar1 = emit->cfg->flags & 0xf00000, fVar1 != FYECF_MODE_FLOW_ONELINE)) &&
         (fVar1 != FYECF_MODE_JSON_ONELINE)) {
        fy_emit_write_indent(emit,indent);
      }
      if ((emit->flags & 1) == 0) {
        fy_emit_putc(emit,fyewt_whitespace,0x20);
        *(byte *)&emit->flags = (byte)emit->flags | 1;
      }
    }
    iVar2 = 0x3a;
    goto LAB_0012605d;
  case di_dash:
    if ((emit->flags & 1) == 0) {
      fy_emit_putc(emit,fyewt_whitespace,0x20);
      *(byte *)&emit->flags = (byte)emit->flags | 1;
    }
    iVar2 = 0x2d;
LAB_0012605d:
    fy_emit_putc(emit,wtype,iVar2);
    *(byte *)&emit->flags = (byte)emit->flags & 0xfa;
    return;
  case di_left_bracket:
  case di_left_brace:
    emit->flow_level = emit->flow_level + 1;
    if ((emit->flags & 1) == 0) {
      fy_emit_putc(emit,fyewt_whitespace,0x20);
      *(byte *)&emit->flags = (byte)emit->flags | 1;
    }
    fy_emit_putc(emit,wtype,(uint)(indicator != di_left_bracket) << 5 | 0x5b);
    emit->flags = (emit->flags & 0xfffffff8) + 1;
    return;
  case di_right_bracket:
  case di_right_brace:
    emit->flow_level = emit->flow_level + -1;
    c = (uint)(indicator != di_right_bracket) << 5 | 0x5d;
    break;
  case di_comma:
    c = 0x2c;
    break;
  case di_bar:
  case di_greater:
    if ((emit->flags & 1) == 0) {
      fy_emit_putc(emit,fyewt_whitespace,0x20);
      *(byte *)&emit->flags = (byte)emit->flags | 1;
    }
    c = 0x3e;
    if (indicator == di_bar) {
      c = 0x7c;
    }
    break;
  case di_single_quote_start:
  case di_double_quote_start:
    if ((emit->flags & 1) == 0) {
      fy_emit_putc(emit,fyewt_whitespace,0x20);
      *(byte *)&emit->flags = (byte)emit->flags | 1;
    }
    bVar3 = indicator == di_single_quote_start;
    goto LAB_00125f55;
  case di_single_quote_end:
  case di_double_quote_end:
    bVar3 = indicator == di_single_quote_end;
LAB_00125f55:
    c = (uint)bVar3 * 5 + 0x22;
    break;
  case di_ambersand:
    if ((emit->flags & 1) == 0) {
      fy_emit_putc(emit,fyewt_whitespace,0x20);
      *(byte *)&emit->flags = (byte)emit->flags | 1;
    }
    iVar2 = 0x26;
    goto LAB_00125fea;
  case di_star:
    if ((emit->flags & 1) == 0) {
      fy_emit_putc(emit,fyewt_whitespace,0x20);
      *(byte *)&emit->flags = (byte)emit->flags | 1;
    }
    iVar2 = 0x2a;
LAB_00125fea:
    fy_emit_putc(emit,wtype,iVar2);
    *(byte *)&emit->flags = (byte)emit->flags & 0xfc;
  default:
    goto switchD_00125e9e_default;
  }
  fy_emit_putc(emit,wtype,c);
  *(byte *)&emit->flags = (byte)emit->flags & 0xf8;
switchD_00125e9e_default:
  return;
}

Assistant:

void fy_emit_write_indicator(struct fy_emitter *emit,
                             enum document_indicator indicator,
                             int flags, int indent,
                             enum fy_emitter_write_type wtype) {
    switch (indicator) {

        case di_question_mark:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, '?');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_OPEN_ENDED);
            break;

        case di_colon:
            if (!(flags & DDNF_SIMPLE)) {
                if (!emit->flow_level && !fy_emit_is_oneline(emit))
                    fy_emit_write_indent(emit, indent);
                if (!fy_emit_whitespace(emit))
                    fy_emit_write_ws(emit);
            }
            fy_emit_putc(emit, wtype, ':');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_OPEN_ENDED);
            break;

        case di_dash:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, '-');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_OPEN_ENDED);
            break;

        case di_left_bracket:
        case di_left_brace:
            emit->flow_level++;
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, indicator == di_left_bracket ? '[' : '{');
            emit->flags |= FYEF_WHITESPACE;
            emit->flags &= ~(FYEF_INDENTATION | FYEF_OPEN_ENDED);
            break;

        case di_right_bracket:
        case di_right_brace:
            emit->flow_level--;
            fy_emit_putc(emit, wtype, indicator == di_right_bracket ? ']' : '}');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION | FYEF_OPEN_ENDED);
            break;

        case di_comma:
            fy_emit_putc(emit, wtype, ',');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION | FYEF_OPEN_ENDED);
            break;

        case di_bar:
        case di_greater:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, indicator == di_bar ? '|' : '>');
            emit->flags &= ~(FYEF_INDENTATION | FYEF_WHITESPACE | FYEF_OPEN_ENDED);
            break;

        case di_single_quote_start:
        case di_double_quote_start:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, indicator == di_single_quote_start ? '\'' : '"');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION | FYEF_OPEN_ENDED);
            break;

        case di_single_quote_end:
        case di_double_quote_end:
            fy_emit_putc(emit, wtype, indicator == di_single_quote_end ? '\'' : '"');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION | FYEF_OPEN_ENDED);
            break;

        case di_ambersand:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, '&');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION);
            break;

        case di_star:
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);
            fy_emit_putc(emit, wtype, '*');
            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION);
            break;
    }
}